

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader.hpp
# Opt level: O2

uint __thiscall
duckdb::BitReader::ReadBytes<unsigned_int,(unsigned_char)4>(BitReader *this,uint8_t *remainder)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ulong in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  bVar2 = InnerReadByte(this,(uint8_t *)((long)&uStack_28 + 7));
  uStack_28._0_7_ = CONCAT16(1,(undefined6)uStack_28);
  bVar3 = InnerReadByte(this,(uint8_t *)((long)&uStack_28 + 6));
  uStack_28._0_6_ = CONCAT15(2,(undefined5)uStack_28);
  bVar4 = InnerReadByte(this,(uint8_t *)((long)&uStack_28 + 5));
  uStack_28._0_5_ = CONCAT14(3,(undefined4)uStack_28);
  bVar5 = InnerReadByte(this,(uint8_t *)((long)&uStack_28 + 4));
  bVar1 = *remainder;
  uStack_28._0_4_ = CONCAT13(4,(undefined3)uStack_28);
  bVar6 = InnerRead(this,remainder,(uint8_t *)((long)&uStack_28 + 3));
  this->index = (uint)*remainder + this->index + 0x20;
  return (uint)bVar6 |
         ((uint)bVar5 | ((uint)bVar4 | (uint)bVar3 << 8 | (uint)bVar2 << 0x10) << 8) <<
         (bVar1 & 0x1f);
}

Assistant:

inline T ReadBytes(const uint8_t &remainder) {
		T result = 0;
		if (BYTES > 0) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(0));
		}
		if (BYTES > 1) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(1));
		}
		if (BYTES > 2) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(2));
		}
		if (BYTES > 3) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(3));
		}
		if (BYTES > 4) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(4));
		}
		if (BYTES > 5) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(5));
		}
		if (BYTES > 6) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(6));
		}
		if (BYTES > 7) {
			result = UnsafeNumericCast<T>(result << 8 | InnerReadByte(7));
		}
		result = UnsafeNumericCast<T>(result << remainder | InnerRead(remainder, BYTES));
		index += (BYTES << 3) + remainder;
		return result;
	}